

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluVerify3(word *pF,int nVars,If_Grp_t *g,If_Grp_t *g2,If_Grp_t *r,word BStruth,
                  word BStruth2,word FStruth)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  word *pwVar7;
  word (*__src) [1024];
  ulong uVar8;
  long lVar9;
  int nWords_2;
  word (*pawVar10) [1024];
  int nWords;
  word pTTRes [1024];
  word pTTWire2 [1024];
  word pTTWire [1024];
  word pTTFans [6] [1024];
  word wStack_12048;
  word *pwStack_12040;
  word awStack_12038 [1024];
  word awStack_10038 [1024];
  word local_e038 [1024];
  word local_c038 [6145];
  
  bVar3 = g->nVars;
  wStack_12048 = BStruth;
  if ((((char)bVar3 < '\x02') || (g2->nVars < '\x02')) || (r->nVars < '\x02')) {
    __assert_fail("g->nVars >= 2 && g2->nVars >= 2 && r->nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x2a5,
                  "void If_CluVerify3(word *, int, If_Grp_t *, If_Grp_t *, If_Grp_t *, word, word, word)"
                 );
  }
  pwStack_12040 = pF;
  if (((6 < bVar3) || (6 < (byte)g2->nVars)) || (6 < (byte)r->nVars)) {
    __assert_fail("g->nVars <= 6 && g2->nVars <= 6 && r->nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x2a6,
                  "void If_CluVerify3(word *, int, If_Grp_t *, If_Grp_t *, If_Grp_t *, word, word, word)"
                 );
  }
  cVar2 = (char)nVars;
  if (TruthAll[0][0] == 0) {
    If_CluInitTruthTables();
    bVar3 = g->nVars;
    if ((char)bVar3 < '\x01') goto LAB_00417109;
  }
  uVar4 = 1 << (cVar2 - 6U & 0x1f);
  if (nVars < 7) {
    uVar4 = 1;
  }
  pwVar7 = local_c038;
  uVar8 = 0;
  do {
    if (0 < (int)uVar4) {
      memcpy(pwVar7,TruthAll + g->pVars[uVar8],(ulong)uVar4 * 8);
    }
    uVar8 = uVar8 + 1;
    pwVar7 = pwVar7 + 0x400;
  } while (bVar3 != uVar8);
LAB_00417109:
  pawVar10 = (word (*) [1024])local_c038;
  If_CluComposeLut(nVars,g,&wStack_12048,pawVar10,local_e038);
  cVar1 = g2->nVars;
  if (0 < (long)cVar1) {
    uVar4 = 1 << (cVar2 - 6U & 0x1f);
    if (nVars < 7) {
      uVar4 = 1;
    }
    lVar9 = 0;
    do {
      if (0 < (int)uVar4) {
        memcpy(pawVar10,TruthAll + g2->pVars[lVar9],(ulong)uVar4 * 8);
      }
      lVar9 = lVar9 + 1;
      pawVar10 = pawVar10 + 1;
    } while (cVar1 != lVar9);
  }
  pawVar10 = (word (*) [1024])local_c038;
  If_CluComposeLut(nVars,g2,&BStruth2,pawVar10,awStack_10038);
  cVar1 = r->nVars;
  if ((long)cVar1 < 1) {
    uVar4 = 1 << (cVar2 - 6U & 0x1f);
  }
  else {
    uVar4 = 1 << (cVar2 - 6U & 0x1f);
    uVar8 = 1;
    if (6 < nVars) {
      uVar8 = (ulong)uVar4;
    }
    lVar9 = 0;
    do {
      iVar5 = (int)r->pVars[lVar9];
      if (iVar5 == nVars) {
        __src = &local_e038;
LAB_0041722c:
        if (0 < (int)uVar8) {
LAB_00417249:
          memcpy(pawVar10,__src,uVar8 * 8);
        }
      }
      else {
        if (nVars + 1 == iVar5) {
          __src = &awStack_10038;
          goto LAB_0041722c;
        }
        if (0 < (int)uVar8) {
          __src = TruthAll + iVar5;
          goto LAB_00417249;
        }
      }
      lVar9 = lVar9 + 1;
      pawVar10 = pawVar10 + 1;
    } while (cVar1 != lVar9);
  }
  If_CluComposeLut(nVars,r,&FStruth,(word (*) [1024])local_c038,awStack_12038);
  pwVar7 = pwStack_12040;
  uVar6 = 1;
  if (6 < nVars) {
    uVar6 = uVar4;
  }
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      if (awStack_12038[uVar8] != pwStack_12040[uVar8]) {
        printf("%d\n",(ulong)(uint)nVars);
        Kit_DsdPrintFromTruth((uint *)&wStack_12048,(int)g->nVars);
        printf("    ");
        If_CluPrintGroup(g);
        Kit_DsdPrintFromTruth((uint *)&BStruth2,(int)g2->nVars);
        printf("    ");
        If_CluPrintGroup(g2);
        Kit_DsdPrintFromTruth((uint *)&FStruth,(int)r->nVars);
        printf("    ");
        If_CluPrintGroup(r);
        Kit_DsdPrintFromTruth((uint *)local_e038,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)awStack_10038,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)awStack_12038,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)pwVar7,nVars);
        putchar(10);
        puts("Verification FAILED!");
        return;
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  return;
}

Assistant:

void If_CluVerify3( word * pF, int nVars, If_Grp_t * g, If_Grp_t * g2, If_Grp_t * r, word BStruth, word BStruth2, word FStruth )
{
    word pTTFans[6][CLU_WRD_MAX], pTTWire[CLU_WRD_MAX], pTTWire2[CLU_WRD_MAX], pTTRes[CLU_WRD_MAX];
    int i;
    assert( g->nVars >= 2 && g2->nVars >= 2 && r->nVars >= 2 );
    assert( g->nVars <= 6 && g2->nVars <= 6 && r->nVars <= 6 );

    if ( TruthAll[0][0] == 0 )
        If_CluInitTruthTables();

    for ( i = 0; i < g->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g->pVars[i]], nVars );
    If_CluComposeLut( nVars, g, &BStruth, pTTFans, pTTWire );

    for ( i = 0; i < g2->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g2->pVars[i]], nVars );
    If_CluComposeLut( nVars, g2, &BStruth2, pTTFans, pTTWire2 );

    for ( i = 0; i < r->nVars; i++ )
        if ( r->pVars[i] == nVars )
            If_CluCopy( pTTFans[i], pTTWire, nVars );
        else if ( r->pVars[i] == nVars + 1 )
            If_CluCopy( pTTFans[i], pTTWire2, nVars );
        else
            If_CluCopy( pTTFans[i], TruthAll[(int)r->pVars[i]], nVars );
    If_CluComposeLut( nVars, r, &FStruth, pTTFans, pTTRes );

    if ( !If_CluEqual(pTTRes, pF, nVars) )
    {
        printf( "%d\n", nVars );
//        If_CluPrintConfig( nVars, g, r, BStruth, pFStruth );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );

        Kit_DsdPrintFromTruth( (unsigned*)&BStruth, g->nVars );   printf( "    " ); If_CluPrintGroup(g);  // printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&BStruth2, g2->nVars ); printf( "    " ); If_CluPrintGroup(g2); // printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&FStruth, r->nVars );   printf( "    " ); If_CluPrintGroup(r);  // printf( "\n" );

        Kit_DsdPrintFromTruth( (unsigned*)pTTWire, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTTWire2, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTTRes, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );
        printf( "Verification FAILED!\n" );
    }
//    else
//        printf( "Verification succeed!\n" );
}